

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

bool __thiscall Json::Value::isInt64(Value *this)

{
  bool bVar1;
  double dVar2;
  longlong val;
  double integral_part;
  longlong local_40;
  string local_38;
  
  bVar1 = true;
  switch(this->field_0x8) {
  case 1:
  case 3:
    break;
  case 2:
    bVar1 = -1 < (this->value_).int_;
    break;
  case 4:
    dVar2 = (this->value_).real_;
    bVar1 = false;
    if ((-9.223372036854776e+18 <= dVar2) && (dVar2 < 9.223372036854776e+18)) {
      dVar2 = modf(dVar2,(double *)&local_38);
      bVar1 = (bool)(-(dVar2 == 0.0) & 1);
    }
    break;
  case 5:
    asString_abi_cxx11_(&local_38,this);
    bVar1 = converToInt64(local_38._M_dataplus._M_p,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (bVar1) {
      return true;
    }
  default:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Value::isInt64() const {
#if defined(JSON_HAS_INT64)
  switch (type_) {
  case int64Value:
  case intValue:
    return true;
  case uintValue:
    return value_.uint_ <= UInt64(maxInt64);
  case realValue:
    // Note that maxInt64 (= 2^63 - 1) is not exactly representable as a
    // double, so double(maxInt64) will be rounded up to 2^63. Therefore we
    // require the value to be strictly less than the limit.
    return value_.real_ >= double(minInt64) &&
           value_.real_ < double(maxInt64) && IsIntegral(value_.real_);
  case stringValue:
    long long int val;

    if (!converToInt64 (asString().c_str(), &val)) {
      break;
    }

    return IsInRange (val, minInt64, maxInt64);
  default:
    break;
  }
#endif // JSON_HAS_INT64
  return false;
}